

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPrivkey *ext_privkey,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list,ByteData *finterprint)

{
  Privkey *this_00;
  Extkey local_c0;
  
  Pubkey::Pubkey(&this->pubkey_);
  this_00 = &this->privkey_;
  Privkey::Privkey(this_00);
  Extkey::Extkey(&(this->extprivkey_).super_Extkey,&ext_privkey->super_Extkey);
  Extkey::Extkey(&(this->extpubkey_).super_Extkey);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->path_,child_num_list);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->fingerprint_,
             &finterprint->data_);
  ExtPrivkey::GetExtPubkey((ExtPubkey *)&local_c0,ext_privkey);
  Extkey::operator=(&(this->extpubkey_).super_Extkey,&local_c0);
  Extkey::~Extkey(&local_c0);
  Privkey::Privkey((Privkey *)&local_c0,&(ext_privkey->super_Extkey).privkey_);
  Privkey::operator=(this_00,(Privkey *)&local_c0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0);
  Privkey::GetPubkey((Pubkey *)&local_c0,this_00);
  ByteData::operator=((ByteData *)this,(ByteData *)&local_c0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0);
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPrivkey& ext_privkey, const std::vector<uint32_t>& child_num_list,
    const ByteData& finterprint)
    : extprivkey_(ext_privkey),
      path_(child_num_list),
      fingerprint_(finterprint) {
  extpubkey_ = ext_privkey.GetExtPubkey();
  privkey_ = ext_privkey.GetPrivkey();
  pubkey_ = privkey_.GetPubkey();
}